

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

__m256i * blend_32_u8_avx2(uint8_t *src0,uint8_t *src1,__m256i *v_m0_b,__m256i *v_m1_b,int32_t bits)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  __m256i v_val_w;
  __m256i v_val_w_00;
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  __m256i *palVar7;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  __m256i *in_RSI;
  __m256i *in_RDI;
  undefined8 in_XMM0_Qa;
  undefined8 uVar8;
  undefined8 in_XMM0_Qb;
  undefined8 uVar9;
  undefined8 in_YMM0_H;
  undefined8 uVar10;
  undefined8 in_register_00001218;
  undefined8 uVar11;
  __m256i v_res;
  __m256i v_res1_w;
  __m256i v_res0_w;
  __m256i v_p1_w;
  __m256i v_p0_w;
  __m256i v_s1_b;
  __m256i v_s0_b;
  undefined8 in_stack_fffffffffffffd10;
  int bits_00;
  undefined8 in_stack_fffffffffffffd18;
  undefined8 in_stack_fffffffffffffd20;
  undefined8 in_stack_fffffffffffffd28;
  longlong in_stack_fffffffffffffd30;
  undefined8 local_2c0;
  undefined8 uStack_2b8;
  undefined8 uStack_2b0;
  undefined8 uStack_2a8;
  undefined8 local_2a0;
  undefined8 uStack_298;
  undefined8 uStack_290;
  undefined8 uStack_288;
  
  palVar7 = in_RSI;
  yy_loadu_256(in_RDI,in_RSI);
  uVar8 = in_XMM0_Qa;
  uVar9 = in_XMM0_Qb;
  uVar10 = in_YMM0_H;
  uVar11 = in_register_00001218;
  yy_loadu_256(in_RSI,palVar7);
  auVar4._8_8_ = in_XMM0_Qb;
  auVar4._0_8_ = in_XMM0_Qa;
  auVar4._16_8_ = in_YMM0_H;
  auVar4._24_8_ = in_register_00001218;
  auVar1._8_8_ = uVar9;
  auVar1._0_8_ = uVar8;
  auVar1._16_8_ = uVar10;
  auVar1._24_8_ = uVar11;
  auVar2 = vpunpcklbw_avx2(auVar4,auVar1);
  auVar3 = vpunpcklbw_avx2(*in_RDX,*in_RCX);
  auVar2 = vpmaddubsw_avx2(auVar2,auVar3);
  auVar6._8_8_ = in_XMM0_Qb;
  auVar6._0_8_ = in_XMM0_Qa;
  auVar6._16_8_ = in_YMM0_H;
  auVar6._24_8_ = in_register_00001218;
  auVar5._8_8_ = uVar9;
  auVar5._0_8_ = uVar8;
  auVar5._16_8_ = uVar10;
  auVar5._24_8_ = uVar11;
  auVar3 = vpunpckhbw_avx2(auVar6,auVar5);
  auVar1 = vpunpckhbw_avx2(*in_RDX,*in_RCX);
  auVar3 = vpmaddubsw_avx2(auVar3,auVar1);
  local_2a0 = auVar2._0_8_;
  uStack_298 = auVar2._8_8_;
  uStack_290 = auVar2._16_8_;
  uStack_288 = auVar2._24_8_;
  v_val_w[1] = in_stack_fffffffffffffd20;
  v_val_w[0] = in_stack_fffffffffffffd18;
  v_val_w[2] = in_stack_fffffffffffffd28;
  v_val_w[3] = in_stack_fffffffffffffd30;
  bits_00 = (int)((ulong)in_stack_fffffffffffffd10 >> 0x20);
  yy_roundn_epu16(v_val_w,bits_00);
  local_2c0 = auVar3._0_8_;
  uStack_2b8 = auVar3._8_8_;
  uStack_2b0 = auVar3._16_8_;
  uStack_2a8 = auVar3._24_8_;
  v_val_w_00[1] = local_2a0;
  v_val_w_00[0] = in_stack_fffffffffffffd18;
  v_val_w_00[2] = uStack_298;
  v_val_w_00[3] = uStack_290;
  palVar7 = yy_roundn_epu16(v_val_w_00,bits_00);
  auVar3._8_8_ = uStack_298;
  auVar3._0_8_ = local_2a0;
  auVar3._16_8_ = uStack_290;
  auVar3._24_8_ = uStack_288;
  auVar2._8_8_ = uStack_2b8;
  auVar2._0_8_ = local_2c0;
  auVar2._16_8_ = uStack_2b0;
  auVar2._24_8_ = uStack_2a8;
  vpackuswb_avx2(auVar3,auVar2);
  return palVar7;
}

Assistant:

static inline __m256i blend_32_u8_avx2(const uint8_t *src0, const uint8_t *src1,
                                       const __m256i *v_m0_b,
                                       const __m256i *v_m1_b,
                                       const int32_t bits) {
  const __m256i v_s0_b = yy_loadu_256(src0);
  const __m256i v_s1_b = yy_loadu_256(src1);

  const __m256i v_p0_w =
      _mm256_maddubs_epi16(_mm256_unpacklo_epi8(v_s0_b, v_s1_b),
                           _mm256_unpacklo_epi8(*v_m0_b, *v_m1_b));
  const __m256i v_p1_w =
      _mm256_maddubs_epi16(_mm256_unpackhi_epi8(v_s0_b, v_s1_b),
                           _mm256_unpackhi_epi8(*v_m0_b, *v_m1_b));

  const __m256i v_res0_w = yy_roundn_epu16(v_p0_w, bits);
  const __m256i v_res1_w = yy_roundn_epu16(v_p1_w, bits);
  const __m256i v_res = _mm256_packus_epi16(v_res0_w, v_res1_w);
  return v_res;
}